

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_DEFI(Context *ctx)

{
  int regnum_00;
  ConstantsList *pCVar1;
  ConstantsList *item;
  int regnum;
  RegisterType regtype;
  Context *ctx_local;
  
  regnum_00 = (ctx->dest_arg).regnum;
  if (ctx->instruction_count == 0) {
    if ((ctx->dest_arg).regtype == REG_TYPE_CONSTINT) {
      pCVar1 = alloc_constant_listitem(ctx);
      if (pCVar1 != (ConstantsList *)0x0) {
        (pCVar1->constant).index = regnum_00;
        (pCVar1->constant).type = MOJOSHADER_UNIFORM_INT;
        *(undefined8 *)&(pCVar1->constant).value = *(undefined8 *)ctx->dwords;
        *(undefined8 *)((long)&(pCVar1->constant).value + 8) = *(undefined8 *)(ctx->dwords + 2);
        set_defined_register(ctx,REG_TYPE_CONSTINT,regnum_00);
      }
    }
    else {
      fail(ctx,"DEFI token using invalid register");
    }
  }
  else {
    fail(ctx,"DEFI token must come before any instructions");
  }
  return;
}

Assistant:

static void state_DEFI(Context *ctx)
{
    const RegisterType regtype = ctx->dest_arg.regtype;
    const int regnum = ctx->dest_arg.regnum;

    // !!! FIXME: fail if same register is defined twice.

    if (ctx->instruction_count != 0)
        fail(ctx, "DEFI token must come before any instructions");
    else if (regtype != REG_TYPE_CONSTINT)
        fail(ctx, "DEFI token using invalid register");
    else
    {
        ConstantsList *item = alloc_constant_listitem(ctx);
        if (item != NULL)
        {
            item->constant.index = regnum;
            item->constant.type = MOJOSHADER_UNIFORM_INT;
            memcpy(item->constant.value.i, ctx->dwords,
                   sizeof (item->constant.value.i));

            set_defined_register(ctx, regtype, regnum);
        } // if
    } // else
}